

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::
getVariants<Kernel::Literal*>
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,Literal *query,
          bool retrieveSubstitutions)

{
  anon_class_8_1_ede4cbcf bindSpecialVar;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *svBindings_00;
  anon_class_32_3_b6b1deac_for__func *this_00;
  byte in_CL;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *in_RSI;
  SmartPtr<Indexing::ResultSubstitution> *in_RDI;
  Leaf *leaf;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  svBindings;
  Literal *normQuery;
  ResultSubstitutionSP resultSubst;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
  renaming;
  nullptr_t in_stack_fffffffffffffed8;
  Literal *in_stack_fffffffffffffee0;
  Renaming *in_stack_fffffffffffffee8;
  Renaming *in_stack_fffffffffffffef0;
  Renaming *in_stack_ffffffffffffff08;
  type in_stack_ffffffffffffff10;
  undefined1 reversed;
  SmartPtr<Indexing::ResultSubstitution> *pSVar1;
  undefined1 in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff31;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
  local_c8;
  SmartPtr<Indexing::ResultSubstitution> local_c0;
  anon_class_32_3_b6b1deac_for__func *in_stack_ffffffffffffff50;
  IterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>
  *in_stack_ffffffffffffff58;
  SmartPtr<Indexing::ResultSubstitution> local_38;
  byte local_19;
  
  local_19 = in_CL & 1;
  pSVar1 = in_RDI;
  if (local_19 == 0) {
    std::
    unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>>
    ::
    unique_ptr<std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>,void>
              ((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
                *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  else {
    std::
    make_unique<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>
              ();
  }
  if ((local_19 & 1) == 0) {
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(&local_38);
    reversed = (undefined1)((ulong)in_RDI >> 0x38);
  }
  else {
    in_stack_ffffffffffffff10 =
         std::
         unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
         ::operator*((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
                      *)in_stack_fffffffffffffee0);
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
              (pSVar1,(ResultSubstitution *)in_RDI,SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0)
              );
    reversed = (undefined1)((ulong)in_RDI >> 0x38);
  }
  if ((local_19 & 1) == 0) {
    in_stack_fffffffffffffef0 =
         (Renaming *)Kernel::Renaming::normalize((Literal *)in_stack_ffffffffffffff10);
  }
  else {
    std::
    unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    ::operator->((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
                  *)0x490270);
    in_stack_ffffffffffffff08 =
         Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
                   ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
                    0x49027c);
    Kernel::Renaming::normalizeVariables
              (in_stack_fffffffffffffef0,(Literal *)in_stack_fffffffffffffee8);
    std::
    unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    ::operator->((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
                  *)0x4902a4);
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
              ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x4902b0);
    Kernel::Renaming::apply(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffffee0);
  bindSpecialVar.svBindings._1_7_ = in_stack_ffffffffffffff31;
  bindSpecialVar.svBindings._0_1_ = in_stack_ffffffffffffff30;
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(auto:1,auto:2)_1_>
            (in_RSI,(Literal *)pSVar1,(bool)reversed,bindSpecialVar);
  svBindings_00 =
       Lib::
       Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
       ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x49037c);
  this_00 = (anon_class_32_3_b6b1deac_for__func *)
            findLeaf((SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *)
                     in_stack_fffffffffffffef0,svBindings_00);
  if (this_00 == (anon_class_32_3_b6b1deac_for__func *)0x0) {
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
    ::getEmpty();
  }
  else {
    (**(code **)(*(long *)this_00 + 0x40))(&stack0xffffffffffffff50);
    Lib::iterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>
              ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)
               in_stack_ffffffffffffff08);
    std::
    unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
    ::unique_ptr((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
                  *)this_00,&local_c8);
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(&local_c0,&local_38);
    Lib::IterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>>::
    map<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    Lib::
    pvi<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs*>,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::_lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)_1_,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>
              ((IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                *)in_RSI);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/SubstitutionTree.hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
    ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:656:16),_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                   *)0x490486);
    getVariants<Kernel::Literal*>(Kernel::Literal*,bool)::
    {lambda(Inferences::ALASCA::BinaryResolutionConf::Rhs*)#1}::~VirtualIterator(this_00);
    Lib::IterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>::
    ~IterTraits((IterTraits<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>_>
                 *)0x49049d);
    Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>::~VirtualIterator
              ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)this_00);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)pSVar1);
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
            ((SmartPtr<Indexing::ResultSubstitution> *)this_00);
  std::
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
  ::~unique_ptr((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::RenamingSubstitution>_>
                 *)this_00);
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
            *)pSVar1;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>> getVariants(Query query, bool retrieveSubstitutions)
    {
      auto renaming = retrieveSubstitutions ? std::make_unique<RenamingSubstitution>() : std::unique_ptr<RenamingSubstitution>(nullptr);
      ResultSubstitutionSP resultSubst = retrieveSubstitutions ? ResultSubstitutionSP(&*renaming) : ResultSubstitutionSP();

      Query normQuery;
      if (retrieveSubstitutions) {
        renaming->_query->normalizeVariables(query);
        normQuery = renaming->_query->apply(query);
      } else {
        normQuery = Renaming::normalize(query);
      }

      Recycled<BindingMap> svBindings;
      createBindings(normQuery, /* reversed */ false,
          [&](auto v, auto t) { {
            svBindings->insert(v, t);
          } });
      Leaf* leaf = findLeaf(*svBindings);
      if(leaf==0) {
        return VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>>::getEmpty();
      } else {
        return pvi(iterTraits(leaf->allChildren())
          .map([retrieveSubstitutions, renaming = std::move(renaming), resultSubst](LeafData* ld) 
            {
              ResultSubstitutionSP subs;
              if (retrieveSubstitutions) {
                renaming->_result->reset();
                renaming->_result->normalizeVariables(ld->key());
                subs = resultSubst;
              }
              return QueryRes(subs, ld);
            }));
      }
    }